

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void slang::SVInt::divide
               (SVInt *lhs,uint32_t lhsWords,SVInt *rhs,uint32_t rhsWords,SVInt *quotient,
               SVInt *remainder)

{
  uint *puVar1;
  uint32_t *__s;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint32_t *value;
  uint32_t i_2;
  uint uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint32_t *dest;
  uint32_t *value_00;
  uint32_t i;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  TempBuffer<unsigned_int,_128UL> scratch;
  
  uVar20 = (ulong)(rhsWords * 2);
  uVar5 = lhsWords * 2;
  uVar15 = (ulong)uVar5;
  TempBuffer<unsigned_int,_128UL>::TempBuffer
            (&scratch,(ulong)(((remainder != (SVInt *)0x0) + 3) * rhsWords * 2 +
                              (uVar5 + rhsWords * -2) * 2 + 1));
  puVar1 = scratch.ptr + uVar15;
  dest = scratch.ptr + uVar15 + 1;
  value_00 = puVar1 + uVar20 + 1;
  memset(scratch.ptr,0,uVar15 * 4 + 4);
  splitWords(lhs,scratch.ptr,lhsWords);
  memset(dest,0,uVar20 * 4);
  splitWords(rhs,dest,rhsWords);
  memset(value_00,0,uVar15 * 4);
  __s = value_00 + uVar15;
  if (remainder == (SVInt *)0x0) {
    value = (uint32_t *)0x0;
  }
  else {
    memset(__s,0,uVar20 * 4);
    value = __s;
  }
  *puVar1 = 0;
  do {
    uVar17 = uVar20;
    if (uVar17 == 0) {
      uVar17 = 0;
      goto LAB_001aaad1;
    }
    uVar20 = uVar17 - 1;
  } while (puVar1[uVar17] == 0);
  uVar5 = uVar5 - (int)uVar17;
LAB_001aaad1:
  uVar19 = uVar5 + lhsWords * -2;
  while ((bVar23 = uVar15 != 0, uVar15 = uVar15 - 1, uVar12 = uVar19, bVar23 &&
         (uVar12 = uVar5, scratch.ptr[uVar15] == 0))) {
    uVar5 = uVar5 - 1;
  }
  uVar20 = (ulong)uVar12;
  iVar18 = (int)uVar17;
  if (iVar18 == 1) {
    uVar5 = *dest;
    uVar15 = (ulong)uVar5;
    uVar17 = 0;
    for (; -1 < (int)uVar20; uVar20 = (ulong)((int)uVar20 - 1)) {
      uVar7 = uVar17 << 0x20;
      uVar19 = scratch.ptr[uVar20];
      uVar17 = (ulong)uVar19;
      uVar7 = uVar7 | uVar17;
      if (uVar7 == 0) {
        value_00[uVar20] = 0;
LAB_001aab45:
        uVar17 = 0;
      }
      else if (uVar7 < uVar15) {
        value_00[uVar20] = 0;
      }
      else {
        if (uVar7 == uVar15) {
          value_00[uVar20] = 1;
          goto LAB_001aab45;
        }
        uVar6 = (uint32_t)(uVar7 / uVar15);
        value_00[uVar20] = uVar6;
        uVar17 = (ulong)(uVar19 - uVar6 * uVar5);
      }
    }
    if (remainder != (SVInt *)0x0) {
      *__s = (uint32_t)uVar17;
    }
  }
  else {
    uVar15 = (ulong)(iVar18 - 1);
    uVar5 = dest[uVar15];
    if (uVar5 == 0) {
      uVar19 = 0x20;
    }
    else {
      uVar19 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar19 = uVar19 ^ 0x1f;
    }
    uVar17 = uVar17 & 0xffffffff;
    bVar4 = (byte)uVar19;
    if (uVar19 == 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      for (uVar7 = 0; uVar12 + iVar18 != uVar7; uVar7 = uVar7 + 1) {
        uVar16 = scratch.ptr[uVar7];
        scratch.ptr[uVar7] = uVar16 << (bVar4 & 0x1f) | uVar5;
        uVar5 = uVar16 >> (0x20 - bVar4 & 0x1f);
      }
      uVar16 = 0;
      for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
        uVar14 = dest[uVar7];
        dest[uVar7] = uVar14 << (bVar4 & 0x1f) | uVar16;
        uVar16 = uVar14 >> (0x20 - bVar4 & 0x1f);
      }
    }
    scratch.ptr[uVar12 + iVar18] = uVar5;
    do {
      iVar2 = (int)uVar20;
      uVar5 = iVar18 + iVar2;
      uVar21 = (ulong)dest[uVar15];
      uVar7 = CONCAT44(scratch.ptr[uVar5],scratch.ptr[(iVar18 + iVar2) - 1]) / uVar21;
      uVar13 = CONCAT44(scratch.ptr[uVar5],scratch.ptr[(iVar18 + iVar2) - 1]) % uVar21;
      if ((uVar7 == 0x100000000) ||
         (uVar10 = (ulong)scratch.ptr[uVar5 - 2] | uVar13 << 0x20, uVar8 = uVar7,
         uVar10 <= dest[iVar18 - 2U] * uVar7 && dest[iVar18 - 2U] * uVar7 - uVar10 != 0)) {
        uVar8 = uVar7 - 1;
        uVar13 = uVar13 + uVar21;
        if ((uVar13 >> 0x20 == 0) &&
           ((uVar8 == 0x100000000 ||
            (uVar13 = (ulong)scratch.ptr[uVar5 - 2] | uVar13 << 0x20,
            uVar13 <= dest[iVar18 - 2U] * uVar8 && dest[iVar18 - 2U] * uVar8 - uVar13 != 0)))) {
          uVar8 = uVar7 - 2;
        }
      }
      lVar22 = 0;
      for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
        uVar12 = dest[uVar7];
        uVar16 = iVar2 + (int)uVar7;
        lVar22 = (ulong)scratch.ptr[uVar16] - (lVar22 + (uVar12 * uVar8 & 0xffffffff));
        scratch.ptr[uVar16] = (uint)lVar22;
        lVar22 = (uVar12 * uVar8 >> 0x20) - (lVar22 >> 0x20);
      }
      uVar12 = scratch.ptr[uVar5];
      scratch.ptr[uVar5] = uVar12 - (int)lVar22;
      value_00[uVar20] = (uint32_t)uVar8;
      if ((long)(ulong)uVar12 < lVar22) {
        value_00[uVar20] = (uint32_t)uVar8 - 1;
        uVar12 = 0;
        for (uVar7 = 0; bVar11 = (byte)uVar12, uVar17 != uVar7; uVar7 = uVar7 + 1) {
          uVar9 = iVar2 + (int)uVar7;
          uVar16 = dest[uVar7];
          uVar14 = scratch.ptr[uVar9];
          uVar3 = uVar14;
          if (uVar16 < uVar14) {
            uVar3 = uVar16;
          }
          uVar14 = uVar12 + uVar16 + uVar14;
          scratch.ptr[uVar9] = uVar14;
          uVar12 = 1;
          if (uVar3 <= uVar14) {
            uVar12 = (uint)(bVar11 & uVar14 == uVar3);
          }
        }
        scratch.ptr[uVar5] = scratch.ptr[uVar5] + uVar12;
      }
      bVar23 = uVar20 != 0;
      uVar20 = uVar20 - 1;
    } while (bVar23);
    if (remainder != (SVInt *)0x0) {
      if (uVar19 == 0) {
        for (; -1 < (int)uVar15; uVar15 = (ulong)((int)uVar15 - 1)) {
          value[uVar15] = scratch.ptr[uVar15];
        }
      }
      else {
        uVar5 = 0;
        for (; -1 < (int)uVar15; uVar15 = (ulong)((int)uVar15 - 1)) {
          uVar19 = scratch.ptr[uVar15];
          value[uVar15] = uVar19 >> (bVar4 & 0x1f) | uVar5;
          uVar5 = uVar19 << (0x20 - bVar4 & 0x1f);
        }
      }
    }
  }
  bVar23 = (bool)((rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag);
  buildDivideResult(quotient,value_00,(lhs->super_SVIntStorage).bitWidth,bVar23,lhsWords);
  buildDivideResult(remainder,value,(rhs->super_SVIntStorage).bitWidth,bVar23,rhsWords);
  TempBuffer<unsigned_int,_128UL>::~TempBuffer(&scratch);
  return;
}

Assistant:

void SVInt::divide(const SVInt& lhs, uint32_t lhsWords, const SVInt& rhs, uint32_t rhsWords,
                   SVInt* quotient, SVInt* remainder) {
    SLANG_ASSERT(lhsWords >= rhsWords);

    // The Knuth algorithm requires arrays of 32-bit words (because results of operations
    // need to fit natively into 64 bits). Allocate space for the backing memory, either on
    // the stack if it's small or on the heap if it's not.
    uint32_t divisorWords = rhsWords * 2;
    uint32_t extraWords = (lhsWords * 2) - divisorWords;
    uint32_t dividendWords = divisorWords + extraWords;

    size_t totalWordsNeeded = (remainder ? 4 : 3) * divisorWords + 2 * extraWords + 1;
    TempBuffer<uint32_t, 128> scratch(totalWordsNeeded);
    uint32_t* u = scratch.get();
    uint32_t* v = u + dividendWords + 1;
    uint32_t* q = v + divisorWords;
    uint32_t* r = remainder ? q + dividendWords : nullptr;

    // Initialize the dividend and divisor
    memset(u, 0, (dividendWords + 1) * sizeof(uint32_t));
    splitWords(lhs, u, lhsWords);

    memset(v, 0, divisorWords * sizeof(uint32_t));
    splitWords(rhs, v, rhsWords);

    // Initialize quotient and remainder
    memset(q, 0, dividendWords * sizeof(uint32_t));
    if (remainder)
        memset(r, 0, divisorWords * sizeof(uint32_t));

    // extra word for spill space in Knuth algorithm
    u[dividendWords] = 0;

    // Adjust sizes for division. The Knuth algorithm will fail if there
    // are empty words in the input.
    for (uint32_t i = divisorWords; i > 0 && v[i - 1] == 0; i--) {
        divisorWords--;
        extraWords++;
    }
    for (uint32_t i = dividendWords; i > 0 && u[i - 1] == 0; i--)
        extraWords--;

    // If we're left with only a single divisor word, Knuth won't work.
    // We can use a sequence of standard 64 bit divides for this.
    dividendWords = divisorWords + extraWords;
    if (divisorWords == 1) {
        uint32_t divisor = v[0];
        uint32_t rem = 0;
        for (int i = int(dividendWords - 1); i >= 0; i--) {
            uint64_t partial_dividend = uint64_t(rem) << 32 | u[i];
            if (partial_dividend == 0) {
                q[i] = 0;
                rem = 0;
            }
            else if (partial_dividend < divisor) {
                q[i] = 0;
                rem = (uint32_t)partial_dividend;
            }
            else if (partial_dividend == divisor) {
                q[i] = 1;
                rem = 0;
            }
            else {
                q[i] = (uint32_t)(partial_dividend / divisor);
                rem = (uint32_t)(partial_dividend - (q[i] * divisor));
            }
        }
        if (r)
            r[0] = rem;
    }
    else {
        // otherwise invoke Knuth
        knuthDiv(u, v, q, r, extraWords, divisorWords);
    }

    bool bothSigned = lhs.signFlag && rhs.signFlag;
    buildDivideResult(quotient, q, lhs.bitWidth, bothSigned, lhsWords);
    buildDivideResult(remainder, r, rhs.bitWidth, bothSigned, rhsWords);
}